

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

void freeset(parse *p,cset *cs)

{
  int iVar1;
  int iVar2;
  cset *pcVar3;
  size_t css;
  cset *top;
  size_t i;
  cset *cs_local;
  parse *p_local;
  
  pcVar3 = p->g->sets;
  iVar1 = p->g->ncsets;
  iVar2 = p->g->csetsize;
  for (top = (cset *)0x0; top < (cset *)(long)iVar2; top = (cset *)((long)&top->ptr + 1)) {
    cs->ptr[(int)top] = cs->ptr[(int)top] & (cs->mask ^ 0xff);
    cs->hash = cs->hash - (char)top;
  }
  if (cs == pcVar3 + (long)iVar1 + -1) {
    p->g->ncsets = p->g->ncsets + -1;
  }
  return;
}

Assistant:

static void
freeset(p, cs)
struct parse *p;
cset *cs;
{
	size_t i;
	cset *top = &p->g->sets[p->g->ncsets];
	size_t css = (size_t)p->g->csetsize;

	for (i = 0; i < css; i++)
		CHsub(cs, i);
	if (cs == top-1)	/* recover only the easy case */
		p->g->ncsets--;
}